

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

void __thiscall
ncnn::ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86(ConvolutionDepthWise_x86 *this)

{
  size_type sVar1;
  reference ppLVar2;
  undefined8 *in_RDI;
  ConvolutionDepthWise *unaff_retaddr;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  int iVar4;
  
  *in_RDI = &PTR__ConvolutionDepthWise_x86_00177520;
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    sVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x3a));
    if ((int)sVar1 <= iVar3) break;
    ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x3a),
                         (long)iVar4);
    if (*ppLVar2 != (value_type)0x0) {
      (*(*ppLVar2)->_vptr_Layer[1])();
    }
    iVar3 = iVar4 + 1;
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x143b8a);
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::~vector
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
             CONCAT44(iVar4,in_stack_fffffffffffffff0));
  ConvolutionDepthWise::~ConvolutionDepthWise(unaff_retaddr);
  return;
}

Assistant:

ConvolutionDepthWise_x86::~ConvolutionDepthWise_x86()
{
    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();
}